

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cpp
# Opt level: O2

TAttributeType __thiscall
glslang::TParseContext::attributeFromName(TParseContext *this,TString *name)

{
  bool bVar1;
  TAttributeType TVar2;
  
  bVar1 = std::operator==(name,"branch");
  TVar2 = EatBranch;
  if ((!bVar1) && (bVar1 = std::operator==(name,"dont_flatten"), !bVar1)) {
    bVar1 = std::operator==(name,"flatten");
    if (bVar1) {
      TVar2 = EatFlatten;
    }
    else {
      bVar1 = std::operator==(name,"unroll");
      if (bVar1) {
        TVar2 = EatUnroll;
      }
      else {
        bVar1 = std::operator==(name,"loop");
        TVar2 = EatLoop;
        if ((!bVar1) && (bVar1 = std::operator==(name,"dont_unroll"), !bVar1)) {
          bVar1 = std::operator==(name,"dependency_infinite");
          if (bVar1) {
            TVar2 = EatDependencyInfinite;
          }
          else {
            bVar1 = std::operator==(name,"dependency_length");
            if (bVar1) {
              TVar2 = EatDependencyLength;
            }
            else {
              bVar1 = std::operator==(name,"min_iterations");
              if (bVar1) {
                TVar2 = EatMinIterations;
              }
              else {
                bVar1 = std::operator==(name,"max_iterations");
                if (bVar1) {
                  TVar2 = EatMaxIterations;
                }
                else {
                  bVar1 = std::operator==(name,"iteration_multiple");
                  if (bVar1) {
                    TVar2 = EatIterationMultiple;
                  }
                  else {
                    bVar1 = std::operator==(name,"peel_count");
                    if (bVar1) {
                      TVar2 = EatPeelCount;
                    }
                    else {
                      bVar1 = std::operator==(name,"partial_count");
                      if (bVar1) {
                        TVar2 = EatPartialCount;
                      }
                      else {
                        bVar1 = std::operator==(name,"subgroup_uniform_control_flow");
                        if (bVar1) {
                          TVar2 = EatSubgroupUniformControlFlow;
                        }
                        else {
                          bVar1 = std::operator==(name,"export");
                          if (bVar1) {
                            TVar2 = EatExport;
                          }
                          else {
                            bVar1 = std::operator==(name,"maximally_reconverges");
                            TVar2 = EatMaximallyReconverges;
                            if (!bVar1) {
                              TVar2 = EatNone;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

TAttributeType TParseContext::attributeFromName(const TString& name) const
{
    if (name == "branch" || name == "dont_flatten")
        return EatBranch;
    else if (name == "flatten")
        return EatFlatten;
    else if (name == "unroll")
        return EatUnroll;
    else if (name == "loop" || name == "dont_unroll")
        return EatLoop;
    else if (name == "dependency_infinite")
        return EatDependencyInfinite;
    else if (name == "dependency_length")
        return EatDependencyLength;
    else if (name == "min_iterations")
        return EatMinIterations;
    else if (name == "max_iterations")
        return EatMaxIterations;
    else if (name == "iteration_multiple")
        return EatIterationMultiple;
    else if (name == "peel_count")
        return EatPeelCount;
    else if (name == "partial_count")
        return EatPartialCount;
    else if (name == "subgroup_uniform_control_flow")
        return EatSubgroupUniformControlFlow;
    else if (name == "export")
        return EatExport;
    else if (name == "maximally_reconverges")
        return EatMaximallyReconverges;
    else
        return EatNone;
}